

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::session_impl::reopen_listen_sockets(session_impl *this,bool map_ports)

{
  address_v6 *paVar1;
  _Atomic_word *p_Var2;
  vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  *this_00;
  pointer plVar3;
  dht_tracker *pdVar4;
  pointer this_01;
  element_type *peVar5;
  natpmp *this_02;
  upnp *this_03;
  lsd *this_04;
  pointer this_05;
  shared_ptr<libtorrent::aux::listen_socket_t> *psVar6;
  element_type *peVar7;
  pointer psVar8;
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *piVar9;
  _WordT _Var10;
  pointer plVar11;
  undefined4 uVar12;
  int iVar13;
  _Atomic_word _Var14;
  iterator __position;
  pointer psVar15;
  pointer psVar16;
  element_type *peVar17;
  iterator iVar18;
  endpoint *extraout_RDX;
  endpoint *ep;
  endpoint *extraout_RDX_00;
  endpoint *extraout_RDX_01;
  endpoint *extraout_RDX_02;
  endpoint *extraout_RDX_03;
  long lVar19;
  alert_manager *paVar20;
  shared_ptr<libtorrent::aux::listen_socket_t> *__begin3;
  shared_ptr<libtorrent::aux::listen_socket_t> *psVar21;
  undefined7 in_register_00000031;
  ulong uVar22;
  implementation_type *piVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  session_impl *this_06;
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  *in_R9;
  shared_ptr<libtorrent::aux::listen_socket_t> *__begin3_3;
  shared_ptr<libtorrent::aux::listen_socket_t> *psVar25;
  listen_interface_t *iface;
  pointer plVar26;
  pointer psVar27;
  pointer ec_00;
  span<const_libtorrent::aux::ip_interface> ifs_00;
  span<const_libtorrent::aux::ip_route> routes_00;
  span<const_libtorrent::aux::ip_interface> ifs_01;
  span<const_libtorrent::aux::ip_interface> ifs_02;
  socket_type_t socket_type;
  error_code ec;
  vector<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_> routes;
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  eps;
  vector<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_> ifs;
  socket_type_t local_139;
  error_code local_138;
  socket_type_t local_121;
  undefined1 local_120 [8];
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_118;
  pointer local_110;
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  alert_manager *local_d0;
  undefined4 local_c4;
  undefined1 local_c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_b0;
  error_handler_interface eStack_a0;
  anon_union_16_3_a3f0114d_for___in6_u local_98;
  undefined1 local_88 [48];
  undefined2 local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [15];
  char local_31;
  
  session_log(this,"reopen listen sockets");
  local_138.val_ = 0;
  local_138.failed_ = false;
  local_138.cat_ =
       &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  if (this->m_abort != false) {
    return;
  }
  local_f8.
  super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.
  super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8.
  super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)&(this->m_settings).m_mutex;
  local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
  local_c0._0_8_ = local_d8;
  ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_c0);
  local_c0[8] = 1;
  iVar13 = (this->m_settings).m_store.m_ints._M_elems[0x7b];
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_c0);
  local_c4 = (undefined4)CONCAT71(in_register_00000031,map_ports);
  if (iVar13 == 0) {
LAB_002ba752:
    enum_net_interfaces((vector<libtorrent::aux::ip_interface,_std::allocator<libtorrent::aux::ip_interface>_>
                         *)local_c0,this->m_io_context,&local_138);
    if ((local_138.failed_ == true) && (((this->m_alerts).m_alert_mask._M_i.m_val & 0x41) != 0)) {
      local_120[0] = 0x17;
      local_139 = tcp;
      alert_manager::
      emplace_alert<libtorrent::listen_failed_alert,char_const(&)[1],libtorrent::operation_t,boost::system::error_code&,libtorrent::socket_type_t>
                (&this->m_alerts,(char (*) [1])0x3de9eb,local_120,&local_138,&local_139);
    }
    enum_routes((vector<libtorrent::aux::ip_route,_std::allocator<libtorrent::aux::ip_route>_> *)
                local_120,this->m_io_context,&local_138);
    if ((local_138.failed_ == true) && (((this->m_alerts).m_alert_mask._M_i.m_val & 0x41) != 0)) {
      local_139 = 0x2a;
      local_121 = tcp;
      alert_manager::
      emplace_alert<libtorrent::listen_failed_alert,char_const(&)[1],libtorrent::operation_t,boost::system::error_code&,libtorrent::socket_type_t>
                (&this->m_alerts,(char (*) [1])0x3de9eb,&local_139,&local_138,&local_121);
    }
    plVar26 = (this->m_listen_interfaces).
              super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
              ._M_impl.super__Vector_impl_data._M_start;
    plVar3 = (this->m_listen_interfaces).
             super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (plVar26 != plVar3) {
      do {
        ifs_01.m_ptr = (ip_interface *)
                       (((long)(local_c0._8_8_ - local_c0._0_8_) >> 4) * -0x70a3d70a3d70a3d7);
        ifs_01.m_len = (difference_type)&local_f8;
        interface_to_endpoints
                  ((aux *)plVar26,(listen_interface_t *)0x1,
                   (listen_socket_flags_t)(uchar)local_c0._0_8_,ifs_01,in_R9);
        plVar26 = plVar26 + 1;
      } while (plVar26 != plVar3);
    }
    if (local_f8.
        super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_f8.
        super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      session_log(this,"no listen sockets");
    }
    ifs_02.m_len = ((long)(local_c0._8_8_ - local_c0._0_8_) >> 4) * -0x70a3d70a3d70a3d7;
    routes_00.m_len =
         (vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
          *)(((long)local_118._M_pi - (long)local_120 >> 3) * -0x70a3d70a3d70a3d7);
    routes_00.m_ptr = (ip_route *)local_120;
    ifs_02.m_ptr = (ip_interface *)local_c0._0_8_;
    expand_unspecified_address(ifs_02,routes_00,&local_f8);
    ifs_00.m_ptr = (ip_interface *)
                   (((long)(local_c0._8_8_ - local_c0._0_8_) >> 4) * -0x70a3d70a3d70a3d7);
    ifs_00.m_len = (difference_type)&local_f8;
    expand_devices((aux *)local_c0._0_8_,ifs_00,routes_00.m_len);
    if (local_120 != (undefined1  [8])0x0) {
      operator_delete((void *)local_120,(long)local_110 - (long)local_120);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      uVar22 = aStack_b0._M_allocated_capacity - local_c0._0_8_;
      paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._0_8_;
LAB_002ba9cc:
      operator_delete(paVar24,uVar22);
    }
  }
  else {
    local_c0._0_8_ = local_d8;
    local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_c0);
    local_c0[8] = 1;
    _Var10 = (this->m_settings).m_store.m_bools.super__Base_bitset<2UL>._M_w[1];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_c0);
    if ((_Var10 & 2) == 0) goto LAB_002ba752;
    plVar26 = (this->m_listen_interfaces).
              super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (plVar26 ==
        (this->m_listen_interfaces).
        super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar19 = random((aux *)0xf618);
      local_88._8_4_ = (int)lVar19 + 2000;
    }
    else {
      local_88._8_4_ = plVar26->port;
    }
    local_c0._8_8_ = (pointer)0x0;
    aStack_b0._M_allocated_capacity = 0;
    local_50 = local_40;
    local_c0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    aStack_b0._8_8_ = 0;
    eStack_a0._vptr_error_handler_interface = (_func_int **)0x0;
    local_98._0_8_ = 0;
    local_98._8_8_ = 0;
    local_88._0_8_ = 0;
    local_88[0x20] = '\0';
    local_88._33_7_ = (undefined7)local_40._1_8_;
    local_88[0x28] = SUB81(local_40._1_8_,7);
    local_88._41_4_ = local_40._9_4_;
    local_88._45_2_ = local_40._13_2_;
    local_88[0x2f] = local_31;
    local_88._24_8_ = (__pthread_internal_list *)0x0;
    local_48 = 0;
    local_40[0] = 0;
    local_58 = 0x800;
    local_88._16_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_88 + 0x20);
    ::std::
    vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>::
    emplace_back<libtorrent::aux::listen_endpoint_t&>
              ((vector<libtorrent::aux::listen_endpoint_t,std::allocator<libtorrent::aux::listen_endpoint_t>>
                *)&local_f8,(listen_endpoint_t *)local_c0);
    this->m_listen_socket_version = this->m_listen_socket_version + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._16_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_88 + 0x20)) {
      uVar22 = CONCAT71(local_88._33_7_,local_88[0x20]) + 1;
      paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._16_8_;
      goto LAB_002ba9cc;
    }
  }
  this_00 = &this->m_listen_sockets;
  __position = partition_listen_sockets(&local_f8,this_00);
  if ((__position._M_current !=
       (this->m_listen_sockets).
       super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (local_f8.
      super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_f8.
      super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    this->m_listen_socket_version = this->m_listen_socket_version + 1;
  }
  ep = extraout_RDX;
  while (__position._M_current !=
         (this->m_listen_sockets).
         super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) {
    pdVar4 = (this->m_dht).
             super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (pdVar4 != (dht_tracker *)0x0) {
      local_c0._0_8_ =
           ((__position._M_current)->
           super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      this_01 = (pointer)((__position._M_current)->
                         super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                         )._M_refcount._M_pi;
      if (this_01 == (pointer)0x0) {
        local_c0._8_8_ = (pointer)0x0;
      }
      else {
        local_c0._8_8_ = this_01;
        if (__libc_single_threaded == '\0') {
          LOCK();
          paVar1 = &(this_01->interface_address).ipv6_address_;
          (paVar1->addr_).__in6_u.__u6_addr32[0] = (paVar1->addr_).__in6_u.__u6_addr32[0] + 1;
          UNLOCK();
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2 = (_Atomic_word *)
                     ((this_01->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr32 + 1);
            *p_Var2 = *p_Var2 + 1;
            UNLOCK();
            goto LAB_002baa90;
          }
        }
        else {
          paVar1 = &(this_01->interface_address).ipv6_address_;
          (paVar1->addr_).__in6_u.__u6_addr32[0] = (paVar1->addr_).__in6_u.__u6_addr32[0] + 1;
        }
        p_Var2 = (_Atomic_word *)
                 ((this_01->interface_address).ipv6_address_.addr_.__in6_u.__u6_addr32 + 1);
        *p_Var2 = *p_Var2 + 1;
      }
LAB_002baa90:
      libtorrent::dht::dht_tracker::delete_socket(pdVar4,(listen_socket_handle *)local_c0);
      ep = extraout_RDX_00;
      if ((pointer)local_c0._8_8_ != (pointer)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2 = (_Atomic_word *)(local_c0._8_8_ + 0xc);
          iVar13 = *p_Var2;
          *p_Var2 = *p_Var2 + -1;
          UNLOCK();
        }
        else {
          iVar13 = *(_Atomic_word *)(local_c0._8_8_ + 0xc);
          *(int *)(local_c0._8_8_ + 0xc) = iVar13 + -1;
        }
        if (iVar13 == 1) {
          (**(code **)(*(long *)local_c0._8_8_ + 0x18))();
          ep = extraout_RDX_01;
        }
      }
      if (this_01 != (pointer)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
        ep = extraout_RDX_02;
      }
    }
    if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) != 0) {
      print_endpoint_abi_cxx11_
                ((string *)local_c0,
                 (aux *)&(((__position._M_current)->
                          super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                          )._M_ptr)->local_endpoint,ep);
      session_log(this,"closing listen socket for %s on device \"%s\"",local_c0._0_8_,
                  ((((__position._M_current)->
                    super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr)->device)._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._0_8_ != &aStack_b0) {
        operator_delete((void *)local_c0._0_8_,(ulong)(aStack_b0._M_allocated_capacity + 1));
      }
    }
    peVar17 = ((__position._M_current)->
              super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr;
    piVar23 = (implementation_type *)
              (peVar17->sock).
              super___shared_ptr<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    if (piVar23 != (implementation_type *)0x0) {
      piVar9 = (io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                *)&piVar23->super_base_implementation_type;
      piVar23 = &((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                   *)&piVar23->super_base_implementation_type)->implementation_;
      boost::asio::detail::reactive_socket_service_base::close
                (&piVar9->service_->super_reactive_socket_service_base,(int)piVar23);
      peVar17 = ((__position._M_current)->
                super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
    }
    iVar13 = (int)piVar23;
    peVar5 = (peVar17->udp_sock).
             super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar5 != (element_type *)0x0) {
      udp_socket::close(&peVar5->sock,iVar13);
      peVar17 = ((__position._M_current)->
                super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
    }
    this_02 = (peVar17->natpmp_mapper).
              super___shared_ptr<libtorrent::natpmp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_02 != (natpmp *)0x0) {
      natpmp::close(this_02,iVar13);
      peVar17 = ((__position._M_current)->
                super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
    }
    this_03 = (peVar17->upnp_mapper).
              super___shared_ptr<libtorrent::upnp,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (this_03 != (upnp *)0x0) {
      upnp::close(this_03,iVar13);
      peVar17 = ((__position._M_current)->
                super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
    }
    this_04 = (peVar17->lsd).super___shared_ptr<libtorrent::aux::lsd,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_04 != (lsd *)0x0) {
      lsd::close(this_04,iVar13);
    }
    __position = ::std::
                 vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                 ::_M_erase(this_00,__position);
    ep = extraout_RDX_03;
  }
  psVar16 = (this_00->
            super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_d0 = (alert_manager *)((long)__position._M_current - (long)psVar16);
  paVar20 = local_d0;
  if (0 < (long)local_d0 >> 6) {
    psVar15 = (pointer)((long)&(psVar16->
                               super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + ((ulong)local_d0 & 0xffffffffffffffc0));
    lVar19 = ((long)local_d0 >> 6) + 1;
    iVar18._M_current = psVar16 + 2;
    do {
      if ((iVar18._M_current[-2].
           super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->incoming_connection != false) {
        iVar18._M_current = iVar18._M_current + -2;
        goto LAB_002bacab;
      }
      if ((iVar18._M_current[-1].
           super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->incoming_connection != false) {
        iVar18._M_current = iVar18._M_current + -1;
        goto LAB_002bacab;
      }
      if ((((iVar18._M_current)->
           super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
          ->incoming_connection != false) goto LAB_002bacab;
      if ((iVar18._M_current[1].
           super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ->incoming_connection != false) {
        iVar18._M_current = iVar18._M_current + 1;
        goto LAB_002bacab;
      }
      lVar19 = lVar19 + -1;
      iVar18._M_current = iVar18._M_current + 4;
    } while (1 < lVar19);
    psVar16 = psVar15;
    paVar20 = (alert_manager *)((long)__position._M_current - (long)psVar15);
  }
  lVar19 = (long)paVar20 >> 4;
  if (lVar19 != 1) {
    if (lVar19 != 2) {
      iVar18._M_current = __position._M_current;
      if ((lVar19 != 3) ||
         (iVar18._M_current = psVar16,
         ((psVar16->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
          )._M_ptr)->incoming_connection != false)) goto LAB_002bacab;
      psVar16 = psVar16 + 1;
    }
    iVar18._M_current = psVar16;
    if (((psVar16->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>)
        ._M_ptr)->incoming_connection != false) goto LAB_002bacab;
    psVar16 = psVar16 + 1;
  }
  iVar18._M_current = psVar16;
  if (((psVar16->super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr)->incoming_connection == false) {
    iVar18._M_current = __position._M_current;
  }
LAB_002bacab:
  counters::set_value(&this->m_stats_counters,0x116,
                      (ulong)(iVar18._M_current != __position._M_current));
  plVar11 = local_f8.
            super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_f8.
      super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_f8.
      super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ec_00 = local_f8.
            super__Vector_base<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>
            ._M_impl.super__Vector_impl_data._M_start;
    do {
      setup_listener((session_impl *)local_c0,(listen_endpoint_t *)this,(error_code *)ec_00);
      if ((local_138.failed_ == false) &&
         ((*(long *)(local_c0._0_8_ + 0xf8) != 0 || (*(long *)(local_c0._0_8_ + 0x108) != 0)))) {
        ::std::
        vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>>>
        ::emplace_back<std::shared_ptr<libtorrent::aux::listen_socket_t>&>
                  ((vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>>>
                    *)this_00,(shared_ptr<libtorrent::aux::listen_socket_t> *)local_c0);
        pdVar4 = (this->m_dht).
                 super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        if ((pdVar4 != (dht_tracker *)0x0) &&
           ((*(char *)(local_c0._0_8_ + 0xf4) != '\x01' &&
            ((*(byte *)(local_c0._0_8_ + 0xf5) & 2) == 0)))) {
          psVar16 = (this->m_listen_sockets).
                    super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          local_120 = (undefined1  [8])
                      psVar16[-1].
                      super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
          this_05 = (pointer)psVar16[-1].
                             super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi;
          if (this_05 == (pointer)0x0) {
            local_118._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          else {
            local_118._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_05;
            if (__libc_single_threaded == '\0') {
              LOCK();
              paVar1 = &(this_05->destination).ipv6_address_;
              (paVar1->addr_).__in6_u.__u6_addr32[0] = (paVar1->addr_).__in6_u.__u6_addr32[0] + 1;
              UNLOCK();
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var2 = (_Atomic_word *)
                         ((this_05->destination).ipv6_address_.addr_.__in6_u.__u6_addr32 + 1);
                *p_Var2 = *p_Var2 + 1;
                UNLOCK();
                goto LAB_002badbb;
              }
            }
            else {
              paVar1 = &(this_05->destination).ipv6_address_;
              (paVar1->addr_).__in6_u.__u6_addr32[0] = (paVar1->addr_).__in6_u.__u6_addr32[0] + 1;
            }
            p_Var2 = (_Atomic_word *)
                     ((this_05->destination).ipv6_address_.addr_.__in6_u.__u6_addr32 + 1);
            *p_Var2 = *p_Var2 + 1;
          }
LAB_002badbb:
          libtorrent::dht::dht_tracker::new_socket(pdVar4,(listen_socket_handle *)local_120);
          if ((pointer)local_118._M_pi != (pointer)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var2 = &(local_118._M_pi)->_M_weak_count;
              _Var14 = *p_Var2;
              *p_Var2 = *p_Var2 + -1;
              UNLOCK();
            }
            else {
              _Var14 = (local_118._M_pi)->_M_weak_count;
              (local_118._M_pi)->_M_weak_count = _Var14 + -1;
            }
            if (_Var14 == 1) {
              (*(*(_func_int ***)&(local_118._M_pi)->_vptr__Sp_counted_base)[3])();
            }
          }
          if (this_05 != (pointer)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_05);
          }
        }
        if (*(long *)(local_c0._0_8_ + 0xf8) != 0) {
          async_accept(this,(shared_ptr<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
                             *)(local_c0._0_8_ + 0xf8),*(transport *)(local_c0._0_8_ + 0xf4));
        }
      }
      if ((pointer)local_c0._8_8_ != (pointer)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c0._8_8_);
      }
      ec_00 = ec_00 + 1;
    } while (ec_00 != plVar11);
  }
  psVar25 = (this->m_listen_sockets).
            super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar6 = (this->m_listen_sockets).
           super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar25 == psVar6) {
    session_log(this,"giving up on binding listen sockets");
  }
  else {
    psVar25 = (shared_ptr<libtorrent::aux::listen_socket_t> *)
              ((long)&(psVar25->
                      super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                      )._M_ptr + (((long)local_d0 << 0x1c) >> 0x1c));
    if ((((this->m_alerts).m_alert_mask._M_i.m_val & 0x40) != 0) && (psVar25 != psVar6)) {
      local_d0 = &this->m_alerts;
      psVar21 = psVar25;
      do {
        local_120 = (undefined1  [8])((ulong)local_120 & 0xffffff0000000000);
        local_118._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             &boost::system::detail::cat_holder<void>::system_category_instance;
        peVar17 = (psVar21->
                  super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
        peVar7 = (peVar17->sock).
                 super___shared_ptr<boost::asio::basic_socket_acceptor<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if (peVar7 != (element_type *)0x0) {
          boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>::local_endpoint
                    ((endpoint_type *)local_c0,(peVar7->impl_).service_,
                     &(peVar7->impl_).implementation_,(error_code *)local_120);
          if (local_120[4] == false) {
            local_139 = tcp;
            if (((psVar21->
                 super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->ssl == ssl) {
              local_139 = tcp_ssl;
            }
            alert_manager::
            emplace_alert<libtorrent::listen_succeeded_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::socket_type_t_const&>
                      (local_d0,(endpoint_type *)local_c0,&local_139);
          }
          peVar17 = (psVar21->
                    super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr;
        }
        peVar5 = (peVar17->udp_sock).
                 super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        if (peVar5 != (element_type *)0x0) {
          boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>::local_endpoint
                    ((endpoint_type *)local_c0,
                     *(reactive_socket_service<boost::asio::ip::udp> **)
                      &(peVar5->sock).m_socket.
                       super_basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                     ,&(peVar5->sock).m_socket.
                       super_basic_datagram_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                       .
                       super_basic_socket<boost::asio::ip::udp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                       .impl_.implementation_,(error_code *)local_120);
          if ((local_120[4] == false) &&
             (peVar17 = (psVar21->
                        super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                        )._M_ptr,
             ((((peVar17->udp_sock).
                super___shared_ptr<libtorrent::aux::session_udp_socket,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->sock).field_0xf0 & 1) == 0)) {
            local_139 = udp;
            if (peVar17->ssl == ssl) {
              local_139 = utp_ssl;
            }
            alert_manager::
            emplace_alert<libtorrent::listen_succeeded_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::socket_type_t_const&>
                      (local_d0,(basic_endpoint<boost::asio::ip::udp> *)local_c0,&local_139);
          }
        }
        psVar21 = psVar21 + 1;
      } while (psVar21 != psVar6);
    }
    local_c0._0_8_ = local_d8;
    local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_c0);
    uVar12 = local_c4;
    local_c0[8] = 1;
    iVar13 = (this->m_settings).m_store.m_ints._M_elems[0x28];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_c0);
    if (iVar13 != 0) {
      update_peer_dscp(this);
    }
    local_138.val_ = 0;
    local_138.failed_ = false;
    local_138.cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    local_c0._0_8_ = local_d8;
    local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_c0);
    local_c0[8] = 1;
    uVar22 = (this->m_settings).m_store.m_bools.super__Base_bitset<2UL>._M_w[0];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_c0);
    psVar21 = psVar25;
    if ((uVar22 >> 0x3c & 1) != 0) {
      for (; psVar21 != psVar6; psVar21 = psVar21 + 1) {
        start_natpmp(this,psVar21);
      }
    }
    local_c0._0_8_ = local_d8;
    local_c0._8_8_ = local_c0._8_8_ & 0xffffffffffffff00;
    ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_c0);
    this_06 = (session_impl *)local_c0;
    local_c0[8] = 1;
    uVar22 = (this->m_settings).m_store.m_bools.super__Base_bitset<2UL>._M_w[0];
    ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)this_06);
    psVar21 = psVar25;
    if ((uVar22 >> 0x3b & 1) != 0) {
      for (; psVar21 != psVar6; psVar21 = psVar21 + 1) {
        this_06 = this;
        start_upnp(this,psVar21);
      }
    }
    if ((char)uVar12 == '\0') {
      for (; psVar25 != psVar6; psVar25 = psVar25 + 1) {
        remap_ports(this_06,remap_natpmp_and_upnp,
                    (psVar25->
                    super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr);
      }
    }
    else {
      psVar15 = (this->m_listen_sockets).
                super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (psVar16 = (this->m_listen_sockets).
                     super__Vector_base<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; psVar16 != psVar15;
          psVar16 = psVar16 + 1) {
        remap_ports(this_06,remap_natpmp_and_upnp,
                    (psVar16->
                    super___shared_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>
                    )._M_ptr);
      }
    }
    update_lsd(this);
    open_new_incoming_i2p_connection(this);
    psVar8 = (this->m_torrents).m_array.
             super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar27 = (this->m_torrents).m_array.
                   super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; psVar27 != psVar8;
        psVar27 = psVar27 + 1) {
      torrent::enable_all_trackers
                ((psVar27->super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>)
                 ._M_ptr);
    }
  }
  ::std::
  vector<libtorrent::aux::listen_endpoint_t,_std::allocator<libtorrent::aux::listen_endpoint_t>_>::
  ~vector(&local_f8);
  return;
}

Assistant:

void session_impl::reopen_listen_sockets(bool const map_ports)
	{
#ifndef TORRENT_DISABLE_LOGGING
		session_log("reopen listen sockets");
#endif

		TORRENT_ASSERT(is_single_thread());

		TORRENT_ASSERT(!m_abort);

		error_code ec;

		if (m_abort) return;

		// first build a list of endpoints we should be listening on
		// we need to remove any unneeded sockets first to avoid the possibility
		// of a new socket failing to bind due to a conflict with a stale socket
		std::vector<listen_endpoint_t> eps;

		// if we don't proxy peer connections, don't apply the special logic for
		// proxies
		if (m_settings.get_int(settings_pack::proxy_type) != settings_pack::none
			&& m_settings.get_bool(settings_pack::proxy_peer_connections))
		{
			// we will be able to accept incoming connections over UDP. so use
			// one of the ports the user specified to use a consistent port
			// across sessions. If the user did not specify any ports, pick one
			// at random
			int const port = m_listen_interfaces.empty()
				? int(random(63000) + 2000)
				: m_listen_interfaces.front().port;
			listen_endpoint_t ep(address_v4::any(), port, {}
				, transport::plaintext, listen_socket_t::proxy);
			eps.emplace_back(ep);
			++m_listen_socket_version;
		}
		else
		{
			std::vector<ip_interface> const ifs = enum_net_interfaces(m_io_context, ec);
			if (ec && m_alerts.should_post<listen_failed_alert>())
			{
				m_alerts.emplace_alert<listen_failed_alert>(""
					, operation_t::enum_if, ec, socket_type_t::tcp);
			}
			auto const routes = enum_routes(m_io_context, ec);
			if (ec && m_alerts.should_post<listen_failed_alert>())
			{
				m_alerts.emplace_alert<listen_failed_alert>(""
					, operation_t::enum_route, ec, socket_type_t::tcp);
			}

			// expand device names and populate eps
			for (auto const& iface : m_listen_interfaces)
			{
#if !TORRENT_USE_SSL
				if (iface.ssl)
				{
#ifndef TORRENT_DISABLE_LOGGING
					session_log("attempted to listen ssl with no library support on device: \"%s\""
						, iface.device.c_str());
#endif
					if (m_alerts.should_post<listen_failed_alert>())
					{
						m_alerts.emplace_alert<listen_failed_alert>(iface.device
							, operation_t::sock_open
							, boost::asio::error::operation_not_supported
							, socket_type_t::tcp_ssl);
					}
					continue;
				}
#endif

				// now we have a device to bind to. This device may actually just be an
				// IP address or a device name. In case it's a device name, we want to
				// (potentially) end up binding a socket for each IP address associated
				// with that device.
				interface_to_endpoints(iface, listen_socket_t::accept_incoming, ifs, eps);
			}

			if (eps.empty())
			{
#ifndef TORRENT_DISABLE_LOGGING
				session_log("no listen sockets");
#endif
			}

#if defined TORRENT_ANDROID && __ANDROID_API__ >= 24
			// For Android API >= 24, enum_routes with the current NETLINK based
			// implementation is unsupported (maybe in the future the operation
			// will be restore using another implementation). If routes is empty,
			// allow using unspecified address is a best effort approach that
			// seems to work. The issue with this approach is with the DHTs,
			// because for IPv6 this is not following BEP 32 and BEP 45. See:
			// https://www.bittorrent.org/beps/bep_0032.html
			// https://www.bittorrent.org/beps/bep_0045.html
			if (!routes.empty()) expand_unspecified_address(ifs, routes, eps);
#else
			expand_unspecified_address(ifs, routes, eps);
#endif
			expand_devices(ifs, eps);
		}

		auto remove_iter = partition_listen_sockets(eps, m_listen_sockets);

		if (remove_iter != m_listen_sockets.end() || !eps.empty())
			++m_listen_socket_version;

		while (remove_iter != m_listen_sockets.end())
		{
#ifndef TORRENT_DISABLE_DHT
			if (m_dht)
				m_dht->delete_socket(*remove_iter);
#endif

#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				session_log("closing listen socket for %s on device \"%s\""
					, print_endpoint((*remove_iter)->local_endpoint).c_str()
					, (*remove_iter)->device.c_str());
			}
#endif
			if ((*remove_iter)->sock) (*remove_iter)->sock->close(ec);
			if ((*remove_iter)->udp_sock) (*remove_iter)->udp_sock->sock.close();
			if ((*remove_iter)->natpmp_mapper) (*remove_iter)->natpmp_mapper->close();
			if ((*remove_iter)->upnp_mapper) (*remove_iter)->upnp_mapper->close();
			if ((*remove_iter)->lsd) (*remove_iter)->lsd->close();
			remove_iter = m_listen_sockets.erase(remove_iter);
		}

		// all sockets in there stayed the same. Only sockets after this point are
		// new and should post alerts
		int const existing_sockets = int(m_listen_sockets.size());

		m_stats_counters.set_value(counters::has_incoming_connections
			, std::any_of(m_listen_sockets.begin(), m_listen_sockets.end()
				, [](std::shared_ptr<listen_socket_t> const& l)
				{ return l->incoming_connection; }));

		// open new sockets on any endpoints that didn't match with
		// an existing socket
		for (auto const& ep : eps)
#ifndef BOOST_NO_EXCEPTIONS
			try
#endif
		{
			std::shared_ptr<listen_socket_t> s = setup_listener(ep, ec);

			if (!ec && (s->sock || s->udp_sock))
			{
				m_listen_sockets.emplace_back(s);

#ifndef TORRENT_DISABLE_DHT
				if (m_dht
					&& s->ssl != transport::ssl
					&& !(s->flags & listen_socket_t::local_network))
				{
					m_dht->new_socket(m_listen_sockets.back());
				}
#endif

				TORRENT_ASSERT(bool(s->flags & listen_socket_t::accept_incoming) == bool(s->sock));
				if (s->sock) async_accept(s->sock, s->ssl);
			}
		}
#ifndef BOOST_NO_EXCEPTIONS
		catch (std::exception const& e)
		{
			TORRENT_UNUSED(e);
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				session_log("setup_listener(%s) device: %s failed: %s"
					, print_endpoint(ep.addr, ep.port).c_str()
					, ep.device.c_str()
					, e.what());
			}
#endif // TORRENT_DISABLE_LOGGING
		}
#endif // BOOST_NO_EXCEPTIONS

		if (m_listen_sockets.empty())
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log("giving up on binding listen sockets");
#endif
			return;
		}

		auto const new_sockets = span<std::shared_ptr<listen_socket_t>>(
			m_listen_sockets).subspan(existing_sockets);

		// now, send out listen_succeeded_alert for the listen sockets we are
		// listening on
		if (m_alerts.should_post<listen_succeeded_alert>())
		{
			for (auto const& l : new_sockets)
			{
				error_code err;
				if (l->sock)
				{
					tcp::endpoint const tcp_ep = l->sock->local_endpoint(err);
					if (!err)
					{
						socket_type_t const socket_type
							= l->ssl == transport::ssl
							? socket_type_t::tcp_ssl
							: socket_type_t::tcp;

						m_alerts.emplace_alert<listen_succeeded_alert>(
							tcp_ep, socket_type);
					}
				}

				if (l->udp_sock)
				{
					udp::endpoint const udp_ep = l->udp_sock->sock.local_endpoint(err);
					if (!err && l->udp_sock->sock.is_open())
					{
						socket_type_t const socket_type
							= l->ssl == transport::ssl
							? socket_type_t::utp_ssl
							: socket_type_t::utp;

						m_alerts.emplace_alert<listen_succeeded_alert>(
							udp_ep, socket_type);
					}
				}
			}
		}

		if (m_settings.get_int(settings_pack::peer_dscp) != 0)
		{
			update_peer_dscp();
		}

		ec.clear();

		if (m_settings.get_bool(settings_pack::enable_natpmp))
		{
			for (auto const& s : new_sockets)
				start_natpmp(s);
		}

		if (m_settings.get_bool(settings_pack::enable_upnp))
		{
			for (auto const& s : new_sockets)
				start_upnp(s);
		}

		if (map_ports)
		{
			for (auto const& s : m_listen_sockets)
				remap_ports(remap_natpmp_and_upnp, *s);
		}
		else
		{
			// new sockets need to map ports even if the caller did not request
			// re-mapping
			for (auto const& s : new_sockets)
				remap_ports(remap_natpmp_and_upnp, *s);
		}

		update_lsd();

#if TORRENT_USE_I2P
		open_new_incoming_i2p_connection();
#endif

		// trackers that were not reachable, may have become reachable now.
		// so clear the "disabled" flags to let them be tried one more time
		// TODO: it would probably be better to do this by having a
		// listen-socket "version" number that gets bumped. And instead of
		// setting a bool to disable a tracker, we set the version number that
		// it was disabled at. This change would affect the ABI in 1.2, so
		// should be done in 2.0 or later
		for (auto& t : m_torrents)
			t->enable_all_trackers();
	}